

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# func.h
# Opt level: O0

int __thiscall GF2::VFunc<7UL,_8UL>::Deg(VFunc<7UL,_8UL> *this)

{
  int iVar1;
  BFunc<7UL> *in_RDI;
  size_t pos;
  int deg;
  int record;
  BFunc<7UL> bf;
  bool in_stack_ffffffffffffff5f;
  undefined8 local_98;
  undefined4 local_8c;
  BFunc<7UL> *in_stack_ffffffffffffff80;
  size_t in_stack_ffffffffffffff88;
  VFunc<7UL,_8UL> *in_stack_ffffffffffffff90;
  BFunc<7UL> *in_stack_ffffffffffffffa0;
  
  BFunc<7UL>::BFunc(in_RDI,in_stack_ffffffffffffff5f);
  local_8c = -1;
  for (local_98 = 0; local_98 < 8; local_98 = local_98 + 1) {
    GetCoord(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    iVar1 = BFunc<7UL>::Deg(in_stack_ffffffffffffffa0);
    if (local_8c < iVar1) {
      local_8c = iVar1;
    }
  }
  return local_8c;
}

Assistant:

int Deg() const
	{	
		BFunc<_n> bf;
		int record = -1, deg;
		for (size_t pos = 0; pos < _m; pos++)
		{
			GetCoord(pos, bf);
			if ((deg = bf.Deg()) > record)
				record = deg;
		}
		return record;
	}